

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_write_triangles(void *a,uint32_t *tria_indices,uint32_t nr_of_triangles)

{
  uint uVar1;
  uint uVar2;
  ssize_t sVar3;
  char *dst;
  int iVar4;
  int __fd;
  uint maxOutputSize;
  ulong __size;
  uint32_t bytes_written;
  uint8_t header;
  uint32_t nr_of_triangles_local;
  uint8_t *b4;
  uint8_t *b3;
  uint8_t *b2;
  uint8_t *b1;
  LZ4_stream_t lz4Stream_body;
  
  header = '\x03';
  nr_of_triangles_local = nr_of_triangles;
  sVar3 = write((int)&header,(void *)0x1,1);
  iVar4 = 0;
  if ((int)sVar3 != 0) {
    sVar3 = write((int)&nr_of_triangles_local,(void *)0x4,1);
    if ((int)sVar3 != 0) {
      uVar2 = nr_of_triangles * 3;
      __size = (ulong)uVar2;
      b1 = (uint8_t *)malloc(__size);
      b2 = (uint8_t *)malloc(__size);
      b3 = (uint8_t *)malloc(__size);
      b4 = (uint8_t *)malloc(__size);
      trico_transpose_uint32_aos_to_soa(&b1,&b2,&b3,&b4,tria_indices,uVar2);
      LZ4_initStream(&lz4Stream_body,0x4020);
      iVar4 = 0;
      maxOutputSize = 0;
      if (uVar2 < 0x7e000001) {
        maxOutputSize = uVar2 + uVar2 / 0xff + 0x10;
      }
      dst = (char *)malloc((ulong)maxOutputSize);
      uVar1 = LZ4_compress_default((char *)b1,dst,uVar2,maxOutputSize);
      bytes_written = uVar1;
      sVar3 = write((int)&bytes_written,(void *)0x4,1);
      if ((int)sVar3 != 0) {
        __fd = (int)dst;
        sVar3 = write(__fd,(void *)0x1,(ulong)uVar1);
        if ((int)sVar3 != 0) {
          uVar1 = LZ4_compress_default((char *)b2,dst,uVar2,maxOutputSize);
          bytes_written = uVar1;
          sVar3 = write((int)&bytes_written,(void *)0x4,1);
          if ((int)sVar3 != 0) {
            sVar3 = write(__fd,(void *)0x1,(ulong)uVar1);
            if ((int)sVar3 != 0) {
              uVar1 = LZ4_compress_default((char *)b3,dst,uVar2,maxOutputSize);
              bytes_written = uVar1;
              sVar3 = write((int)&bytes_written,(void *)0x4,1);
              if ((int)sVar3 != 0) {
                sVar3 = write(__fd,(void *)0x1,(ulong)uVar1);
                if ((int)sVar3 != 0) {
                  uVar2 = LZ4_compress_default((char *)b4,dst,uVar2,maxOutputSize);
                  bytes_written = uVar2;
                  sVar3 = write((int)&bytes_written,(void *)0x4,1);
                  if ((int)sVar3 != 0) {
                    sVar3 = write(__fd,(void *)0x1,(ulong)uVar2);
                    if ((int)sVar3 != 0) {
                      free(dst);
                      free(b1);
                      free(b2);
                      free(b3);
                      free(b4);
                      iVar4 = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int trico_write_triangles(void* a, const uint32_t* tria_indices, uint32_t nr_of_triangles)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)trico_triangle_uint32_stream;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_triangles, sizeof(uint32_t), 1, arch))
    return 0;

  uint8_t* b1 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b2 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b3 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b4 = (uint8_t*)trico_malloc(nr_of_triangles * 3);

  trico_transpose_uint32_aos_to_soa(&b1, &b2, &b3, &b4, tria_indices, nr_of_triangles * 3);

  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  unsigned estimateLen = LZ4_COMPRESSBOUND(nr_of_triangles * 3);
  uint8_t* compressed_buf = (uint8_t*)trico_malloc(estimateLen);

  uint32_t bytes_written = (uint32_t)LZ4_compress_default((const char*)b1, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b2, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b3, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b4, (char*)compressed_buf, (int)nr_of_triangles * 3, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  trico_free(compressed_buf);

  trico_free(b1);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);

  return 1;
  }